

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryObject.cpp
# Opt level: O3

void __thiscall
chatra::TemporaryObject::setFrameMethod
          (TemporaryObject *this,size_t frameIndex,Package *package,MethodTable *methodTable,
          Method *refMethod,Method *setMethod,bool hasArgs)

{
  pointer pAVar1;
  
  this->type = FrameMethod;
  (this->targetRef).node = (ReferenceNode *)0x0;
  this->frameIndex = frameIndex;
  this->package = package;
  this->methodTable = methodTable;
  this->method0 = refMethod;
  this->method1 = setMethod;
  this->methodHasArgs = hasArgs;
  this->hasName = false;
  this->hasArgs = false;
  this->hasSetArg = false;
  this->hasVarArgOp = false;
  pAVar1 = (this->args).
           super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->args).super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
      _M_impl.super__Vector_impl_data._M_finish != pAVar1) {
    (this->args).super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
    _M_impl.super__Vector_impl_data._M_finish = pAVar1;
  }
  return;
}

Assistant:

void TemporaryObject::setFrameMethod(size_t frameIndex, Package* package, const MethodTable* methodTable,
		const Method* refMethod, const Method* setMethod, bool hasArgs) {

	chatra_assert(methodTable != nullptr);
	chatra_assert(frameIndex == SIZE_MAX || (thread.frames[frameIndex].scope->getScopeType() != ScopeType::Thread &&
			thread.frames[frameIndex].scope->getScopeType() != ScopeType::Global &&
			thread.frames[frameIndex].scope->getScopeType() != ScopeType::Package));

	type = Type::FrameMethod;
	clearTargetRef();
	this->frameIndex = frameIndex;
	this->package = package;
	this->methodTable = methodTable;
	method0 = refMethod;
	method1 = setMethod;
	methodHasArgs = hasArgs;
	clearRestrictions();
}